

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap.h
# Opt level: O0

char * f2cstrv2(char *fstr,char *cstr,int felem_len,int celem_len,int nelem)

{
  int local_2c;
  int local_28;
  int j;
  int i;
  int nelem_local;
  int celem_len_local;
  int felem_len_local;
  char *cstr_local;
  char *fstr_local;
  
  _celem_len_local = cstr;
  if (nelem != 0) {
    cstr_local = fstr;
    for (local_28 = 0; local_28 < nelem; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < felem_len; local_2c = local_2c + 1) {
        *_celem_len_local = *cstr_local;
        _celem_len_local = _celem_len_local + 1;
        cstr_local = cstr_local + 1;
      }
      *_celem_len_local = '\0';
      kill_trailingn(_celem_len_local + -(long)felem_len,' ',_celem_len_local);
      _celem_len_local = _celem_len_local + (celem_len - felem_len);
    }
  }
  return _celem_len_local + -(long)(celem_len * nelem);
}

Assistant:

static char *f2cstrv2(char *fstr, char* cstr, int felem_len, int celem_len,
               int nelem)
{
   int i,j;

   if( nelem )
      for (i=0; i<nelem; i++, cstr+=(celem_len-felem_len)) {
	 for (j=0; j<felem_len; j++) *cstr++ = *fstr++;
	 *cstr='\0';
	 kill_trailingn( cstr-felem_len, ' ', cstr );
      }
   return( cstr-celem_len*nelem );
}